

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flat.h
# Opt level: O0

void wasm::Flat::verifyFlatness(Function *func)

{
  bool bVar1;
  size_t in_RCX;
  uchar *in_R8;
  size_t in_R9;
  undefined1 local_e8 [8];
  VerifyFlatness verifier;
  Function *func_local;
  
  verifier.super_PostWalker<VerifyFlatness,_wasm::UnifiedExpressionVisitor<VerifyFlatness,_void>_>.
  super_Walker<VerifyFlatness,_wasm::UnifiedExpressionVisitor<VerifyFlatness,_void>_>.currModule =
       (Module *)func;
  verifyFlatness::VerifyFlatness::VerifyFlatness((VerifyFlatness *)local_e8);
  Walker<VerifyFlatness,_wasm::UnifiedExpressionVisitor<VerifyFlatness,_void>_>::walkFunction
            ((Walker<VerifyFlatness,_wasm::UnifiedExpressionVisitor<VerifyFlatness,_void>_> *)
             local_e8,(Function *)
                      verifier.
                      super_PostWalker<VerifyFlatness,_wasm::UnifiedExpressionVisitor<VerifyFlatness,_void>_>
                      .
                      super_Walker<VerifyFlatness,_wasm::UnifiedExpressionVisitor<VerifyFlatness,_void>_>
                      .currModule);
  Walker<VerifyFlatness,_wasm::UnifiedExpressionVisitor<VerifyFlatness,_void>_>::setFunction
            ((Walker<VerifyFlatness,_wasm::UnifiedExpressionVisitor<VerifyFlatness,_void>_> *)
             local_e8,(Function *)
                      verifier.
                      super_PostWalker<VerifyFlatness,_wasm::UnifiedExpressionVisitor<VerifyFlatness,_void>_>
                      .
                      super_Walker<VerifyFlatness,_wasm::UnifiedExpressionVisitor<VerifyFlatness,_void>_>
                      .currModule);
  bVar1 = wasm::Type::isConcrete
                    ((Type *)(((verifier.
                                super_PostWalker<VerifyFlatness,_wasm::UnifiedExpressionVisitor<VerifyFlatness,_void>_>
                                .
                                super_Walker<VerifyFlatness,_wasm::UnifiedExpressionVisitor<VerifyFlatness,_void>_>
                               .currModule)->elementSegments).
                              super__Vector_base<std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>,_std::allocator<std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start + 1));
  verifyFlatness::VerifyFlatness::verify
            ((VerifyFlatness *)local_e8,(EVP_PKEY_CTX *)(ulong)((byte)~bVar1 & 1),
             (uchar *)"function bodies must not flow values",in_RCX,in_R8,in_R9);
  verifyFlatness::VerifyFlatness::~VerifyFlatness((VerifyFlatness *)local_e8);
  return;
}

Assistant:

inline void verifyFlatness(Function* func) {
  struct VerifyFlatness
    : public PostWalker<VerifyFlatness,
                        UnifiedExpressionVisitor<VerifyFlatness>> {
    void visitExpression(Expression* curr) {
      if (Properties::isControlFlowStructure(curr)) {
        verify(!curr->type.isConcrete(),
               "control flow structures must not flow values");
      } else if (auto* set = curr->dynCast<LocalSet>()) {
        verify(!set->isTee() || set->type == Type::unreachable,
               "tees are not allowed, only sets");
        verify(!Properties::isControlFlowStructure(set->value),
               "set values cannot be control flow");
      } else {
        for (auto* child : ChildIterator(curr)) {
          bool isRefAsNonNull =
            child->is<RefAs>() && child->cast<RefAs>()->op == RefAsNonNull;
          verify(Properties::isConstantExpression(child) ||
                   child->is<LocalGet>() || child->is<Unreachable>() ||
                   isRefAsNonNull,
                 "instructions must only have constant expressions, local.get, "
                 "or unreachable as children");
        }
      }
    }

    void verify(bool condition, const char* message) {
      if (!condition) {
        Fatal() << "IR must be flat: run --flatten beforehand (" << message
                << ", in " << getFunction()->name << ')';
      }
    }
  };

  VerifyFlatness verifier;
  verifier.walkFunction(func);
  verifier.setFunction(func);
  verifier.verify(!func->body->type.isConcrete(),
                  "function bodies must not flow values");
}